

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>::
reserve(vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
        *this,size_t n)

{
  Transform **ppTVar1;
  iterator ppTVar2;
  ulong in_RSI;
  vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
  *in_RDI;
  int i;
  Transform **ra;
  Transform **in_stack_ffffffffffffffc8;
  polymorphic_allocator<const_pbrt::Transform_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    ppTVar1 = pmr::polymorphic_allocator<pbrt::Transform_const*>::
              allocate_object<pbrt::Transform_const*>
                        (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 =
           (polymorphic_allocator<const_pbrt::Transform_*> *)(ppTVar1 + local_1c);
      ppTVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Transform_const*>::
      construct<pbrt::Transform_const*,pbrt::Transform_const*>
                ((polymorphic_allocator<pbrt::Transform_const*> *)in_RDI,
                 (Transform **)in_stack_ffffffffffffffd0,ppTVar2 + local_1c);
      ppTVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::Transform_const*>::destroy<pbrt::Transform_const*>
                ((polymorphic_allocator<pbrt::Transform_const*> *)in_RDI,ppTVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::Transform_const*>::deallocate_object<pbrt::Transform_const*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x5554e4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = ppTVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }